

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct.cpp
# Opt level: O3

bool __thiscall
spvtools::val::Construct::IsStructuredExit(Construct *this,ValidationState_t *_,BasicBlock *dest)

{
  uint16_t uVar1;
  pointer ppVar2;
  BasicBlock *pBVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  BasicBlock *other;
  BasicBlock *pBVar8;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *use;
  pointer ppVar9;
  Instruction *pIVar10;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar11;
  
  switch(this->type_) {
  case kSelection:
    if (this->exit_block_ == dest) {
      return true;
    }
    pBVar3 = this->entry_block_;
    ppVar2 = (pBVar3->label_->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar9 = (pBVar3->label_->uses_).
                  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1)
    {
      uVar1 = (ppVar9->first->inst_).opcode;
      if ((((uVar1 == 0xf6) || (uVar1 == 0xf7)) && (ppVar9->second == 1)) &&
         ((bVar4 = BasicBlock::structurally_dominates(ppVar9->first->block_,pBVar3), bVar4 &&
          (other = ppVar9->first->block_, other != pBVar3)))) goto LAB_00655bb1;
    }
    other = BasicBlock::immediate_structural_dominator(pBVar3);
LAB_00655bb1:
    if (other != (BasicBlock *)0x0) {
      bVar4 = false;
      do {
        pIVar10 = other->terminator_;
        uVar1 = pIVar10[-1].inst_.opcode;
        if ((uVar1 == 0xf6) ||
           (((uVar1 == 0xf7 && ((pBVar3->terminator_->inst_).opcode != 0xfb)) &&
            ((pIVar10->inst_).opcode == 0xfb)))) {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar10 + -1,0);
          pVar11 = val::Function::GetBlock(pIVar10[-1].function_,uVar6);
          bVar5 = BasicBlock::structurally_dominates(pVar11.first,pBVar3);
          if (!bVar5) {
            if ((bVar4) && (pIVar10[-1].inst_.opcode != 0xf6)) {
LAB_00655cd4:
              uVar1 = (pIVar10->inst_).opcode;
            }
            else {
              if (dest->id_ == uVar6) {
                return true;
              }
              if (pIVar10[-1].inst_.opcode != 0xf6) goto LAB_00655cd4;
              uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar10 + -1,1);
              if (dest->id_ == uVar6) {
                return true;
              }
              uVar1 = (pIVar10->inst_).opcode;
              if (pIVar10[-1].inst_.opcode == 0xf6) {
                return false;
              }
            }
            bVar4 = (bool)(bVar4 | uVar1 == 0xfb);
            goto LAB_00655ce0;
          }
          ppVar2 = (other->label_->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar9 = (other->label_->uses_).
                        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2;
              ppVar9 = ppVar9 + 1) {
            uVar1 = (ppVar9->first->inst_).opcode;
            if ((((uVar1 == 0xf6) || (uVar1 == 0xf7)) && (ppVar9->second == 1)) &&
               ((bVar5 = BasicBlock::structurally_dominates(ppVar9->first->block_,other), bVar5 &&
                (pBVar8 = ppVar9->first->block_, pBVar8 != other)))) goto LAB_00655d3b;
          }
        }
        else {
LAB_00655ce0:
          ppVar2 = (other->label_->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar9 = (other->label_->uses_).
                        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2;
              ppVar9 = ppVar9 + 1) {
            uVar1 = (ppVar9->first->inst_).opcode;
            if (((uVar1 == 0xf6) || (uVar1 == 0xf7)) &&
               ((ppVar9->second == 1 &&
                ((bVar5 = BasicBlock::structurally_dominates(ppVar9->first->block_,other), bVar5 &&
                 (pBVar8 = ppVar9->first->block_, pBVar8 != other)))))) goto LAB_00655d3b;
          }
        }
        pBVar8 = BasicBlock::immediate_structural_dominator(other);
LAB_00655d3b:
        other = pBVar8;
      } while (pBVar8 != (BasicBlock *)0x0);
    }
    break;
  case kContinue:
    pBVar3 = (*(this->corresponding_constructs_).
               super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
               ._M_impl.super__Vector_impl_data._M_start)->entry_block_;
    uVar6 = Instruction::GetOperandAs<unsigned_int>(pBVar3->terminator_ + -1,0);
    if (pBVar3 == dest) {
      return true;
    }
    if (dest->id_ == uVar6) {
      return true;
    }
    break;
  case kLoop:
    pIVar10 = this->entry_block_->terminator_ + -1;
    uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar10,0);
    uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
    if (dest->id_ == uVar6) {
      return true;
    }
    if (dest->id_ == uVar7) {
      return true;
    }
    break;
  case kCase:
    __assert_fail("type() != ConstructType::kCase",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/construct.cpp"
                  ,0x86,
                  "bool spvtools::val::Construct::IsStructuredExit(ValidationState_t &, BasicBlock *) const"
                 );
  default:
    __assert_fail("type() == ConstructType::kSelection",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/construct.cpp"
                  ,0x9c,
                  "bool spvtools::val::Construct::IsStructuredExit(ValidationState_t &, BasicBlock *) const"
                 );
  }
  return false;
}

Assistant:

ConstructType Construct::type() const { return type_; }